

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.h
# Opt level: O0

bool pbrt::Refract(Vector3f *wi,Normal3f *n,Float eta,Vector3f *wt)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  float *pfVar4;
  undefined8 *in_RDX;
  float in_XMM0_Da;
  undefined1 extraout_var [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  Vector3<float> VVar10;
  Float cosTheta_t;
  Float sin2Theta_t;
  Float sin2Theta_i;
  Float cosTheta_i;
  Normal3<float> *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined8 in_stack_ffffffffffffff28;
  float d;
  Vector3<float> *c;
  undefined4 in_stack_ffffffffffffff30;
  float fVar11;
  Tuple3<pbrt::Vector3,_float> *in_stack_ffffffffffffff38;
  float in_stack_ffffffffffffff44;
  Vector3<float> local_a4;
  undefined8 local_98;
  float local_90;
  undefined8 local_88;
  float local_80;
  undefined8 local_78;
  float local_70;
  undefined8 local_68;
  float local_60;
  undefined8 local_58;
  float local_50;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  type local_2c;
  undefined8 *local_28;
  float local_1c;
  undefined1 auVar9 [56];
  
  d = (float)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  local_28 = in_RDX;
  local_1c = in_XMM0_Da;
  local_2c = Dot<float>((Normal3<float> *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                        (Vector3<float> *)in_stack_ffffffffffffff18);
  local_34 = 0.0;
  auVar3 = vfmadd213ss_fma(ZEXT416((uint)local_2c),ZEXT416((uint)-local_2c),
                           SUB6416(ZEXT464(0x3f800000),0));
  local_38 = auVar3._0_4_;
  pfVar4 = std::max<float>(&local_34,&local_38);
  fVar11 = *pfVar4;
  local_30 = fVar11;
  local_3c = Sqr<float>(local_1c);
  local_3c = fVar11 / local_3c;
  bVar2 = local_3c < 1.0;
  if (bVar2) {
    local_40 = SafeSqrt(0.0);
    auVar9 = extraout_var;
    VVar10 = Tuple3<pbrt::Vector3,_float>::operator-
                       ((Tuple3<pbrt::Vector3,_float> *)
                        CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    local_70 = VVar10.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar5._0_8_ = VVar10.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar5._8_56_ = auVar9;
    local_78 = vmovlpd_avx(auVar5._0_16_);
    auVar9 = (undefined1  [56])0x0;
    local_68 = local_78;
    local_60 = local_70;
    VVar10 = Tuple3<pbrt::Vector3,float>::operator/
                       ((Tuple3<pbrt::Vector3,_float> *)CONCAT44(fVar11,in_stack_ffffffffffffff30),d
                       );
    local_80 = VVar10.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar6._0_8_ = VVar10.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar6._8_56_ = auVar9;
    local_88 = vmovlpd_avx(auVar6._0_16_);
    c = &local_a4;
    local_58 = local_88;
    local_50 = local_80;
    Vector3<float>::Vector3<float>
              ((Vector3<float> *)CONCAT44(local_2c / local_1c - local_40,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18);
    auVar9 = (undefined1  [56])0x0;
    VVar10 = operator*(in_stack_ffffffffffffff44,in_stack_ffffffffffffff38);
    local_90 = VVar10.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar7._0_8_ = VVar10.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar7._8_56_ = auVar9;
    local_98 = vmovlpd_avx(auVar7._0_16_);
    VVar10 = Tuple3<pbrt::Vector3,float>::operator+
                       ((Tuple3<pbrt::Vector3,_float> *)CONCAT44(fVar11,in_stack_ffffffffffffff30),c
                       );
    auVar8._0_8_ = VVar10.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar8._8_56_ = auVar9;
    uVar1 = vmovlpd_avx(auVar8._0_16_);
    *local_28 = uVar1;
    *(float *)(local_28 + 1) = VVar10.super_Tuple3<pbrt::Vector3,_float>.z;
  }
  return bVar2;
}

Assistant:

PBRT_CPU_GPU
inline bool Refract(const Vector3f &wi, const Normal3f &n, Float eta, Vector3f *wt) {
    // Compute $\cos\,\theta_\roman{t}$ using Snell's law
    Float cosTheta_i = Dot(n, wi);
    Float sin2Theta_i = std::max<Float>(0, 1 - cosTheta_i * cosTheta_i);
    Float sin2Theta_t = sin2Theta_i / Sqr(eta);
    // Handle total internal reflection for transmission
    if (sin2Theta_t >= 1)
        return false;

    Float cosTheta_t = SafeSqrt(1 - sin2Theta_t);

    *wt = -wi / eta + (cosTheta_i / eta - cosTheta_t) * Vector3f(n);
    return true;
}